

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeString(Interpreter *this,UString *v)

{
  anon_union_8_3_4e909c26_for_v aVar1;
  Value VVar2;
  Value r;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_stack_00000038;
  Interpreter *in_stack_00000040;
  
  aVar1.h = &(anonymous_namespace)::Interpreter::
             makeHeap<jsonnet::internal::(anonymous_namespace)::HeapString,std::__cxx11::u32string_const&>
                       (in_stack_00000040,in_stack_00000038)->super_HeapEntity;
  VVar2.v.h = aVar1.h;
  VVar2._0_8_ = 0x13;
  return VVar2;
}

Assistant:

Value makeString(const UString &v)
    {
        Value r;
        r.t = Value::STRING;
        r.v.h = makeHeap<HeapString>(v);
        return r;
    }